

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void __thiscall google::protobuf::FatalException::~FatalException(FatalException *this)

{
  FatalException *in_RDI;
  
  ~FatalException(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

FatalException::~FatalException() throw() {}